

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O1

void Mvc_CoverAddDupCubeTail(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  int *piVar1;
  Mvc_Cube_t *pMVar2;
  long lVar3;
  long lVar4;
  Mvc_Cube_t *pMVar5;
  uint uVar6;
  bool bVar7;
  
  pMVar2 = Mvc_CubeAlloc(pCover);
  uVar6 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
  if (uVar6 == 0) {
    pMVar2->pData[0] = pCube->pData[0];
  }
  else if (uVar6 == 1) {
    pMVar2->pData[0] = pCube->pData[0];
    *(undefined4 *)&pMVar2->field_0x14 = *(undefined4 *)&pCube->field_0x14;
  }
  else {
    lVar3 = (ulong)(*(uint *)&pMVar2->field_0x8 & 0xffffff) + 4;
    do {
      pMVar2->pData[lVar3 + -4] = pCube->pData[lVar3 + -4];
      lVar4 = lVar3 + -4;
      bVar7 = lVar3 != 4;
      lVar3 = lVar3 + -1;
    } while (bVar7 && -1 < lVar4);
  }
  if ((pCover->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    pMVar5 = (Mvc_Cube_t *)&pCover->lCubes;
  }
  else {
    pMVar5 = (pCover->lCubes).pTail;
  }
  pMVar5->pNext = pMVar2;
  (pCover->lCubes).pTail = pMVar2;
  pMVar2->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Mvc_CoverAddDupCubeTail( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    Mvc_Cube_t * pCubeNew;
    // copy the cube as part of this cover
    pCubeNew = Mvc_CubeAlloc( pCover );
    Mvc_CubeBitCopy( pCubeNew, pCube );
    // clean the last bits of the new cube
//    pCubeNew->pData[pCubeNew->iLast] &= (BITS_FULL >> pCubeNew->nUnused);
    // add the cube at the end
    Mvc_CoverAddCubeTail( pCover, pCubeNew );
}